

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall PowerPos<0,_0,_0>::propagate_x(PowerPos<0,_0,_0> *this)

{
  int iVar1;
  uint uVar2;
  IntVar *pIVar3;
  IntVar *pIVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  IntVar *pIVar8;
  long lVar9;
  long lVar10;
  int64_t m_v;
  long lVar11;
  double dVar12;
  
  dVar12 = pow((double)(((this->z).var)->min).v,1.0 / (double)(((this->y).var)->max).v);
  dVar12 = ceil(dVar12);
  lVar5 = (long)dVar12;
  pIVar8 = (this->x).var;
  pIVar4 = (this->y).var;
  lVar7 = (long)(pIVar8->min).v;
  pIVar3 = (this->z).var;
  if (lVar7 < lVar5) {
    lVar11 = lVar5 + -1;
    iVar1 = (pIVar4->max).v;
    if ((long)iVar1 == 0) {
      lVar10 = 1;
    }
    else if (lVar11 == 0) {
      lVar10 = 0;
    }
    else {
      lVar10 = lVar11;
      if (1 < iVar1) {
        lVar9 = (long)iVar1 + -1;
        do {
          lVar10 = lVar10 * lVar11;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
    }
    if (lVar10 < (pIVar3->min).v) {
      lVar11 = lVar5;
    }
    if (lVar7 < lVar11) {
      if (so.lazy == true) {
        iVar1 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[8])(pIVar3);
        uVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar6 = (ulong)uVar2 << 0x20 | (long)iVar1 << 2 | 3;
        pIVar8 = (this->x).var;
      }
      else {
        uVar6 = 0;
      }
      iVar1 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xe])(pIVar8,lVar11,uVar6,1);
      if ((char)iVar1 == '\0') {
        return false;
      }
      pIVar4 = (this->y).var;
      pIVar3 = (this->z).var;
    }
  }
  dVar12 = pow((double)(pIVar3->max).v,1.0 / (double)(pIVar4->min).v);
  dVar12 = floor(dVar12);
  lVar5 = (long)dVar12;
  pIVar4 = (this->x).var;
  lVar7 = (long)(pIVar4->max).v;
  if (lVar7 <= lVar5) {
    return true;
  }
  pIVar3 = (this->z).var;
  lVar11 = lVar5 + 1;
  iVar1 = (((this->y).var)->min).v;
  if ((long)iVar1 == 0) {
    lVar10 = 1;
  }
  else if (lVar11 == 0) {
    lVar10 = 0;
  }
  else {
    lVar10 = lVar11;
    if (1 < iVar1) {
      lVar9 = (long)iVar1 + -1;
      do {
        lVar10 = lVar10 * lVar11;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
  }
  if ((pIVar3->max).v < lVar10) {
    lVar11 = lVar5;
  }
  if (lVar11 < lVar7) {
    if (so.lazy == true) {
      iVar1 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[9])(pIVar3);
      uVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (ulong)uVar2 << 0x20 | (long)iVar1 << 2 | 3;
      pIVar4 = (this->x).var;
    }
    else {
      uVar6 = 0;
    }
    iVar1 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xf])(pIVar4,lVar11,uVar6,1);
    if ((char)iVar1 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate_x() {
		// Propagation on the lower bound
		double pow_res;
		pow_res = pow(z.getMin(), 1 / (double)y.getMax());
		int64_t x_min_new = static_cast<int64_t>(ceil(pow_res));
		if (x_min_new > x.getMin()) {
			// Check for numerical errors and correct them
			if (z.getMin() <= my_pow(x_min_new - 1, y.getMax())) {
				x_min_new--;
			}
			setDom(x, setMin, x_min_new, z.getMinLit(), y.getMaxLit());
		}
		// Propagation on the upper bound
		pow_res = pow(z.getMax(), 1 / (double)y.getMin());
		int64_t x_max_new = static_cast<int64_t>(floor(pow_res));
		if (x_max_new < x.getMax()) {
			// Check for numerical errors and correct them
			if (z.getMax() >= my_pow(x_max_new + 1, y.getMin())) {
				x_max_new++;
			}
			setDom(x, setMax, x_max_new, z.getMaxLit(), y.getMinLit());
		}
		return true;
	}